

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void init_tables(void)

{
  UINT8 (*paUVar1) [8];
  int iVar2;
  long lVar3;
  UINT8 *pUVar4;
  UINT8 *pUVar5;
  UINT8 step;
  long lVar6;
  byte bVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int *piVar11;
  double dVar12;
  double dVar13;
  
  if (tablesInit == '\0') {
    tablesInit = '\x01';
    piVar11 = tl_tab;
    lVar9 = 0;
    do {
      lVar8 = lVar9 + 1;
      dVar12 = exp2((double)(int)lVar8 * 0.03125 * 0.125);
      dVar12 = floor(65536.0 / dVar12);
      iVar2 = ((int)dVar12 >> 5) + (uint)(((uint)(int)dVar12 >> 4 & 1) != 0);
      tl_tab[lVar9 * 2] = iVar2 * 4;
      tl_tab[lVar9 * 2 + 1] = iVar2 * -4;
      bVar7 = 1;
      lVar3 = 0x804;
      do {
        iVar2 = tl_tab[lVar9 * 2] >> (bVar7 & 0x1f);
        *(int *)((long)piVar11 + lVar3 + -4) = iVar2;
        *(int *)((long)piVar11 + lVar3) = -iVar2;
        bVar7 = bVar7 + 1;
        lVar3 = lVar3 + 0x800;
      } while (lVar3 != 0x6804);
      piVar11 = piVar11 + 2;
      lVar9 = lVar8;
    } while (lVar8 != 0x100);
    iVar2 = 1;
    lVar9 = 0;
    do {
      dVar12 = sin((double)iVar2 * 3.141592653589793 * 0.0009765625);
      dVar13 = log(*(double *)(&DAT_0017b800 + (ulong)(0.0 < dVar12) * 8) / dVar12);
      dVar13 = ((dVar13 * 8.0) / 0.6931471805599453) * 32.0;
      *(uint *)((long)sin_tab + lVar9) =
           (uint)(dVar12 < 0.0) | (int)(dVar13 + dVar13) + 1U & 0xfffffffe;
      iVar2 = iVar2 + 2;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x1000);
    paUVar1 = lfo_pm_output;
    lVar9 = 0;
    do {
      lVar3 = 0;
      do {
        lVar8 = 0;
        pUVar5 = *paUVar1;
        do {
          lVar6 = 0;
          bVar7 = 0;
          pUVar4 = pUVar5;
          do {
            if (((uint)lVar3 >> ((uint)lVar6 & 0x1f) & 1) != 0) {
              bVar7 = bVar7 + *pUVar4;
            }
            lVar6 = lVar6 + 1;
            pUVar4 = pUVar4 + 0x40;
          } while (lVar6 != 7);
          lVar6 = lVar8 + lVar3 * 0x100 + lVar9 * 0x20;
          lfo_pm_table[lVar6] = (uint)bVar7;
          uVar10 = (ulong)((uint)lVar6 ^ 7);
          lfo_pm_table[uVar10 + 8] = (uint)bVar7;
          lfo_pm_table[lVar6 + 0x10] = -(uint)bVar7;
          lfo_pm_table[uVar10 + 0x18] = -(uint)bVar7;
          lVar8 = lVar8 + 1;
          pUVar5 = pUVar5 + 1;
        } while (lVar8 != 8);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x80);
      lVar9 = lVar9 + 1;
      paUVar1 = (UINT8 (*) [8])((long)paUVar1 + 8);
    } while (lVar9 != 8);
  }
  return;
}

Assistant:

static void init_tables(void)
{
	signed int i,x;
	signed int n;
	double o,m;

	if (tablesInit)
		return;
	tablesInit = 1;

	/* build Linear Power Table */
	for (x=0; x<TL_RES_LEN; x++)
	{
		m = (1<<16) / pow(2, (x+1) * (ENV_STEP/4.0) / 8.0);
		m = floor(m);

		/* we never reach (1<<16) here due to the (x+1) */
		/* result fits within 16 bits at maximum */

		n = (int)m;     /* 16 bits here */
		n >>= 4;        /* 12 bits here */
		if (n&1)        /* round to nearest */
			n = (n>>1)+1;
		else
			n = n>>1;
						/* 11 bits here (rounded) */
		n <<= 2;        /* 13 bits here (as in real chip) */


		/* 14 bits (with sign bit) */
		tl_tab[ x*2 + 0 ] = n;
		tl_tab[ x*2 + 1 ] = -tl_tab[ x*2 + 0 ];

		/* one entry in the 'Power' table use the following format, xxxxxyyyyyyyys with:            */
		/*        s = sign bit                                                                      */
		/* yyyyyyyy = 8-bits decimal part (0-TL_RES_LEN)                                            */
		/* xxxxx    = 5-bits integer 'shift' value (0-31) but, since Power table output is 13 bits, */
		/*            any value above 13 (included) would be discarded.                             */
		for (i=1; i<13; i++)
		{
			tl_tab[ x*2+0 + i*2*TL_RES_LEN ] =  tl_tab[ x*2+0 ]>>i;
			tl_tab[ x*2+1 + i*2*TL_RES_LEN ] = -tl_tab[ x*2+0 + i*2*TL_RES_LEN ];
		}
#if 0
		logerror("tl %04i", x);
		for (i=0; i<13; i++)
			logerror(", [%02i] %4x", i*2, tl_tab[ x*2 /*+1*/ + i*2*TL_RES_LEN ]);
		logerror("\n");
#endif
	}
	/*logerror("FM.C: TL_TAB_LEN = %i elements (%i bytes)\n",TL_TAB_LEN, (int)sizeof(tl_tab));*/


	/* build Logarithmic Sinus table */
	for (i=0; i<SIN_LEN; i++)
	{
		/* non-standard sinus */
		m = sin( ((i*2)+1) * M_PI / SIN_LEN ); /* checked against the real chip */
		/* we never reach zero here due to ((i*2)+1) */

		if (m>0.0)
			o = 8*log(1.0/m)/log(2.0);  /* convert to 'decibels' */
		else
			o = 8*log(-1.0/m)/log(2.0); /* convert to 'decibels' */

		o = o / (ENV_STEP/4);

		n = (int)(2.0*o);
		if (n&1)            /* round to nearest */
			n = (n>>1)+1;
		else
			n = n>>1;

		/* 13-bits (8.5) value is formatted for above 'Power' table */
		sin_tab[ i ] = n*2 + (m>=0.0? 0: 1 );
		/*logerror("FM.C: sin [%4i]= %4i (tl_tab value=%5i)\n", i, sin_tab[i],tl_tab[sin_tab[i]]);*/
	}

	/*logerror("FM.C: ENV_QUIET= %08x\n",ENV_QUIET );*/


	/* build LFO PM modulation table */
	for(i = 0; i < 8; i++) /* 8 PM depths */
	{
		UINT8 fnum;
		for (fnum=0; fnum<128; fnum++) /* 7 bits meaningful of F-NUMBER */
		{
			UINT8 value;
			UINT8 step;
			UINT32 offset_depth = i;
			UINT32 offset_fnum_bit;
			UINT32 bit_tmp;

			for (step=0; step<8; step++)
			{
				value = 0;
				for (bit_tmp=0; bit_tmp<7; bit_tmp++) /* 7 bits */
				{
					if (fnum & (1<<bit_tmp)) /* only if bit "bit_tmp" is set */
					{
						offset_fnum_bit = bit_tmp * 8;
						value += lfo_pm_output[offset_fnum_bit + offset_depth][step];
					}
				}
				/* 32 steps for LFO PM (sinus) */
				lfo_pm_table[(fnum*32*8) + (i*32) + step   + 0] = value;
				lfo_pm_table[(fnum*32*8) + (i*32) +(step^7)+ 8] = value;
				lfo_pm_table[(fnum*32*8) + (i*32) + step   +16] = -value;
				lfo_pm_table[(fnum*32*8) + (i*32) +(step^7)+24] = -value;
			}
#if 0
			logerror("LFO depth=%1x FNUM=%04x (<<4=%4x): ", i, fnum, fnum<<4);
			for (step=0; step<16; step++) /* dump only positive part of waveforms */
				logerror("%02x ", lfo_pm_table[(fnum*32*8) + (i*32) + step] );
			logerror("\n");
#endif

		}
	}
}